

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O0

bool __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::InstMatcher::matchNext
          (InstMatcher *this,uint specVar,TermList nodeTerm,bool separate)

{
  bool bVar1;
  byte in_CL;
  Stack<Kernel::TermList> *in_RDI;
  undefined1 in_stack_00000247;
  InstMatcher *in_stack_00000248;
  TermList in_stack_00000250;
  TermList in_stack_00000258;
  TermList in_stack_ffffffffffffffd0;
  
  if ((in_CL & 1) != 0) {
    Kernel::TermList::empty();
    Lib::Stack<Kernel::TermList>::push(in_RDI,in_stack_ffffffffffffffd0);
  }
  Kernel::TermList::TermList
            ((TermList *)in_stack_ffffffffffffffd0._content,(uint)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  bVar1 = matchNextAux(in_stack_00000248,in_stack_00000258,in_stack_00000250,(bool)in_stack_00000247
                      );
  return bVar1;
}

Assistant:

bool SubstitutionTree<LeafData_>::InstMatcher::matchNext(unsigned specVar, TermList nodeTerm, bool separate)
{
  if(separate) {
    _boundVars.push(TermList::empty());
  }

#if VDEBUG
  {
    //we assert that all the special variables in the nodeTerm are unbound
    VariableIterator vit(nodeTerm);
    while(vit.hasNext()) {
      TermList var=vit.next();
      if(var.isSpecialVar()) {
  ASS(!isBound(var));
      }
    }
  }
#endif
  return matchNextAux(TermList(specVar, true), nodeTerm, separate);
}